

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  fpclass_type fVar14;
  int32_t iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint end_00;
  uint uVar21;
  long lVar22;
  uint start_00;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  Element *pEVar28;
  Element local_78;
  long local_38;
  
  uVar23 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar16 = end_00 - start;
    if (0x18 < (int)uVar16) {
LAB_0030d2af:
      start_00 = (uint)uVar23;
      iVar17 = (uVar16 >> 1) + start_00;
      pNVar1 = keys + iVar17;
      local_78.val.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 8);
      local_78.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)keys[iVar17].val.m_backend.data._M_elems;
      local_78.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar17].val.m_backend.data._M_elems + 4;
      local_78.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_78.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_78.val.m_backend.exp = keys[iVar17].val.m_backend.exp;
      local_78.val.m_backend.neg = keys[iVar17].val.m_backend.neg;
      local_78.val.m_backend.fpclass = keys[iVar17].val.m_backend.fpclass;
      local_78.val.m_backend.prec_elem = keys[iVar17].val.m_backend.prec_elem;
      local_78.idx = keys[iVar17].idx;
      local_38 = (long)(int)end_00;
      lVar19 = (long)(int)start_00;
      lVar20 = -local_38;
      uVar27 = uVar23;
      uVar16 = end_00;
LAB_0030d384:
      iVar17 = (int)uVar27;
      if ((type & 1U) == 0) {
        if (iVar17 < (int)end_00) {
          pEVar28 = keys + iVar17;
          lVar22 = 0;
          do {
            iVar18 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::ElementCompare::operator()(compare,pEVar28,&local_78);
            if (0 < iVar18) {
              uVar26 = iVar17 - (int)lVar22;
              break;
            }
            lVar22 = lVar22 + -1;
            pEVar28 = pEVar28 + 1;
            uVar26 = end_00;
          } while (iVar17 + lVar20 != lVar22);
          uVar27 = (ulong)uVar26;
        }
        if ((int)uVar16 <= (int)start_00) goto LAB_0030d4d3;
        uVar26 = (uint)uVar27;
        lVar22 = (long)(int)uVar16;
        pEVar28 = keys + lVar22;
        do {
          iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar28,&local_78);
          if (iVar17 < 1) goto LAB_0030d4c4;
          lVar22 = lVar22 + -1;
          pEVar28 = pEVar28 + -1;
          uVar16 = start_00;
        } while (lVar19 < lVar22);
        goto LAB_0030d4c9;
      }
      if (iVar17 < (int)end_00) {
        pEVar28 = keys + iVar17;
        lVar22 = 0;
        do {
          iVar18 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar28,&local_78);
          if (-1 < iVar18) {
            uVar26 = iVar17 - (int)lVar22;
            break;
          }
          lVar22 = lVar22 + -1;
          pEVar28 = pEVar28 + 1;
          uVar26 = end_00;
        } while (iVar17 + lVar20 != lVar22);
        uVar27 = (ulong)uVar26;
      }
      uVar26 = (uint)uVar27;
      if ((int)start_00 < (int)uVar16) {
        lVar22 = (long)(int)uVar16;
        pEVar28 = keys + lVar22;
        do {
          iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar28,&local_78);
          if (iVar17 < 0) goto LAB_0030d4c4;
          lVar22 = lVar22 + -1;
          pEVar28 = pEVar28 + -1;
          uVar16 = start_00;
        } while (lVar19 < lVar22);
        goto LAB_0030d4c9;
      }
      goto LAB_0030d4d3;
    }
LAB_0030d83a:
    if (0 < (int)uVar16) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                (keys,end_00,compare,start);
    }
  }
  return;
LAB_0030d4c4:
  uVar16 = (uint)lVar22;
LAB_0030d4c9:
  uVar27 = (ulong)uVar26;
LAB_0030d4d3:
  iVar17 = (int)uVar27;
  if ((int)uVar16 <= iVar17) goto LAB_0030d5a3;
  uVar5 = *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 8);
  uVar6 = *(undefined8 *)keys[iVar17].val.m_backend.data._M_elems;
  uVar7 = *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 2);
  puVar2 = keys[iVar17].val.m_backend.data._M_elems + 4;
  uVar8 = *(undefined8 *)puVar2;
  uVar9 = *(undefined8 *)(puVar2 + 2);
  iVar18 = keys[iVar17].val.m_backend.exp;
  bVar3 = keys[iVar17].val.m_backend.neg;
  iVar4 = keys[iVar17].idx;
  uVar10 = *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 2);
  puVar2 = keys[(int)uVar16].val.m_backend.data._M_elems + 4;
  uVar11 = *(undefined8 *)puVar2;
  uVar12 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)keys[iVar17].val.m_backend.data._M_elems =
       *(undefined8 *)keys[(int)uVar16].val.m_backend.data._M_elems;
  *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 2) = uVar10;
  puVar2 = keys[iVar17].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar11;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 8) =
       *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 8);
  keys[iVar17].val.m_backend.exp = keys[(int)uVar16].val.m_backend.exp;
  keys[iVar17].val.m_backend.neg = keys[(int)uVar16].val.m_backend.neg;
  keys[iVar17].idx = keys[(int)uVar16].idx;
  *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 8) = uVar5;
  puVar2 = keys[(int)uVar16].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar8;
  *(undefined8 *)(puVar2 + 2) = uVar9;
  *(undefined8 *)keys[(int)uVar16].val.m_backend.data._M_elems = uVar6;
  *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 2) = uVar7;
  keys[(int)uVar16].val.m_backend.exp = iVar18;
  keys[(int)uVar16].val.m_backend.neg = bVar3;
  fVar14 = keys[iVar17].val.m_backend.fpclass;
  iVar15 = keys[iVar17].val.m_backend.prec_elem;
  iVar13 = keys[(int)uVar16].val.m_backend.prec_elem;
  keys[iVar17].val.m_backend.fpclass = keys[(int)uVar16].val.m_backend.fpclass;
  keys[iVar17].val.m_backend.prec_elem = iVar13;
  keys[(int)uVar16].val.m_backend.fpclass = fVar14;
  keys[(int)uVar16].val.m_backend.prec_elem = iVar15;
  keys[(int)uVar16].idx = iVar4;
  uVar27 = (ulong)(iVar17 + 1);
  uVar16 = uVar16 - 1;
  goto LAB_0030d384;
LAB_0030d5a3:
  if ((type & 1U) == 0) {
    if ((int)start_00 < (int)uVar16) {
      uVar24 = (ulong)(int)uVar16;
      pEVar28 = keys + uVar24;
      do {
        iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_78,pEVar28);
        uVar25 = uVar24;
        if (0 < iVar17) break;
        uVar24 = uVar24 - 1;
        pEVar28 = pEVar28 + -1;
        uVar25 = uVar23;
      } while (lVar19 < (long)uVar24);
      uVar16 = (uint)uVar25;
    }
    if (uVar16 == end_00) {
      uVar5 = *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[(int)uVar16].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar16].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar17 = keys[(int)uVar16].val.m_backend.exp;
      bVar3 = keys[(int)uVar16].val.m_backend.neg;
      iVar18 = keys[(int)uVar16].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[(int)uVar16].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[(int)uVar16].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[(int)uVar16].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[(int)uVar16].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar16].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar16].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar17;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar14 = keys[(int)uVar16].val.m_backend.fpclass;
      iVar15 = keys[(int)uVar16].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar16].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar16].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar18;
      uVar16 = uVar16 - 1;
    }
  }
  else {
    if (iVar17 < (int)end_00) {
      pEVar28 = keys + iVar17;
      lVar20 = iVar17 - local_38;
      lVar19 = 0;
      do {
        iVar18 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_78,pEVar28);
        if (iVar18 < 0) {
          uVar26 = iVar17 - (int)lVar19;
          break;
        }
        lVar19 = lVar19 + -1;
        pEVar28 = pEVar28 + 1;
        uVar26 = end_00;
      } while (lVar20 != lVar19);
      uVar27 = (ulong)uVar26;
    }
    uVar26 = (uint)uVar27;
    if (uVar26 == start_00) {
      uVar5 = *(undefined8 *)(keys[(int)uVar26].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[(int)uVar26].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[(int)uVar26].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar26].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar17 = keys[(int)uVar26].val.m_backend.exp;
      bVar3 = keys[(int)uVar26].val.m_backend.neg;
      iVar18 = keys[(int)uVar26].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[(int)uVar26].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar26].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[(int)uVar26].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[(int)uVar26].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[(int)uVar26].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar26].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar26].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar17;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar14 = keys[(int)uVar26].val.m_backend.fpclass;
      iVar15 = keys[(int)uVar26].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar26].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar26].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar18;
      uVar27 = (ulong)(uVar26 + 1);
    }
  }
  uVar26 = (uint)uVar27;
  if ((int)(end_00 - uVar26) < (int)(uVar16 - start_00)) {
    uVar27 = uVar23;
    uVar21 = uVar16;
    uVar16 = end_00;
    start_00 = uVar26;
    if ((int)end_00 <= (int)uVar26) goto LAB_0030d820;
  }
  else {
    uVar23 = uVar27;
    uVar21 = end_00;
    if ((int)uVar16 <= (int)start_00) goto LAB_0030d820;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
            (keys,uVar16 + 1,compare,start_00,(bool)(~type & 1));
  uVar23 = uVar27;
LAB_0030d820:
  end_00 = uVar21;
  type = (bool)(type ^ 1);
  start = (int)uVar23;
  uVar16 = end_00 - start;
  if ((int)uVar16 < 0x19) goto LAB_0030d83a;
  goto LAB_0030d2af;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}